

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseapp.cpp
# Opt level: O1

void __thiscall
piksel::BaseApp::updateFramebufferSize(BaseApp *this,int framebufferWidth,int framebufferHeight)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  this->framebufferWidth = framebufferWidth;
  this->framebufferHeight = framebufferHeight;
  (*glad_glViewport)(0,0,framebufferWidth,framebufferHeight);
  fVar2 = (float)this->width;
  fVar3 = (float)framebufferWidth / (float)framebufferHeight;
  fVar1 = (float)this->height;
  fVar4 = fVar2 / fVar1;
  if (fVar4 <= fVar3) {
    fVar2 = fVar2 * (fVar3 / fVar4);
    fVar4 = -(fVar2 + 0.0) / fVar2;
    fVar3 = fVar1;
  }
  else {
    fVar3 = (fVar4 / fVar3) * fVar1;
    fVar4 = -fVar2 / fVar2;
    fVar1 = fVar3 + 0.0;
  }
  (this->projectionMatrix).value[0].field_0.field_0.x = 2.0 / fVar2;
  *(undefined8 *)((long)&(this->projectionMatrix).value[0].field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->projectionMatrix).value[0].field_0 + 0xc) = 0;
  (this->projectionMatrix).value[1].field_0.field_0.y = 2.0 / (0.0 - fVar3);
  *(undefined8 *)((long)&(this->projectionMatrix).value[1].field_0 + 8) = 0;
  *(undefined8 *)&(this->projectionMatrix).value[2].field_0 = 0;
  *(undefined8 *)((long)&(this->projectionMatrix).value[2].field_0 + 8) = 0xbf800000;
  (this->projectionMatrix).value[3].field_0.field_0.x = fVar4;
  (this->projectionMatrix).value[3].field_0.field_0.y = -fVar1 / (0.0 - fVar3);
  *(undefined8 *)((long)&(this->projectionMatrix).value[3].field_0 + 8) = 0x3f80000000000000;
  return;
}

Assistant:

void BaseApp::updateFramebufferSize(int framebufferWidth, int framebufferHeight) {
    this->framebufferWidth = framebufferWidth;
    this->framebufferHeight = framebufferHeight;
    glViewport(0, 0, framebufferWidth, framebufferHeight);
    float framebufferRatio = framebufferWidth / (float) framebufferHeight;
    float ratio = width / (float) height;
    if (framebufferRatio >= ratio) {
        projectionMatrix = glm::ortho(0.0f, (framebufferRatio / ratio) * width, (float) height, 0.0f);
    } else {
        projectionMatrix = glm::ortho(0.0f, (float) width, (ratio / framebufferRatio) * height, 0.0f);
    }
#if FXAA
    if (postfx_texture) {
        glBindTexture(GL_TEXTURE_2D, postfx_texture);
        glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, framebufferWidth, framebufferHeight, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL);
    }
#endif
}